

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_quad_read_lane_at_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  ValueKind VVar2;
  Id IVar3;
  undefined8 in_RAX;
  Builder *this;
  Value *pVVar4;
  Value *pVVar5;
  Operation *pOVar6;
  undefined8 local_38;
  
  local_38 = in_RAX;
  this = Converter::Impl::builder(impl);
  if ((impl->execution_mode_meta).synthesize_dummy_derivatives == true) {
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar1);
    return true;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  if ((impl->execution_model & ~ExecutionModelTessellationControl) == ExecutionModelFragment) {
    pVVar5 = LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
    if (VVar2 == ConstantInt) {
      pOVar6 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,(Value *)instruction);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,3,false);
      Operation::add_id(pOVar6,IVar1);
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      Operation::add_id(pOVar6,IVar1);
      IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      Operation::add_id(pOVar6,IVar1);
      local_38 = CONCAT44(local_38._4_4_,0x44);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this->capabilities,(Capability *)&local_38);
      goto LAB_0016b5f7;
    }
  }
  IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSubgroupLocalInvocationId)
  ;
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar6 = Converter::Impl::allocate(impl,OpLoad,IVar3);
  Operation::add_id(pOVar6,IVar1);
  Converter::Impl::add(impl,pOVar6,false);
  IVar1 = pOVar6->id;
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar6 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
  Operation::add_id(pOVar6,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,0xfffffffc,false);
  Operation::add_id(pOVar6,IVar1);
  Converter::Impl::add(impl,pOVar6,false);
  IVar1 = pOVar6->id;
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar6 = Converter::Impl::allocate(impl,OpIAdd,IVar3);
  Operation::add_id(pOVar6,IVar1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(pOVar6,IVar1);
  Converter::Impl::add(impl,pOVar6,false);
  IVar1 = pOVar6->id;
  pOVar6 = Converter::Impl::allocate(impl,OpGroupNonUniformShuffle,(Value *)instruction);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,3,false);
  Operation::add_id(pOVar6,IVar3);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(pOVar6,IVar3);
  Operation::add_id(pOVar6,IVar1);
  local_38 = CONCAT44(0x41,(Capability)local_38);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,(Capability *)((long)&local_38 + 4));
  Converter::Impl::suggest_maximum_wave_size(impl,0x20);
LAB_0016b5f7:
  (impl->shader_analysis).require_subgroup_shuffles = true;
  Converter::Impl::add(impl,pOVar6,false);
  return true;
}

Assistant:

bool emit_wave_quad_read_lane_at_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		impl.rewrite_value(instruction, impl.get_id_for_value(instruction->getOperand(1)));
		return true;
	}

	auto *lane = instruction->getOperand(2);

	Operation *op;
	if (execution_model_can_quad_op(impl.execution_model) && llvm::isa<llvm::ConstantInt>(lane))
	{
		op = impl.allocate(spv::OpGroupNonUniformQuadBroadcast, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(impl.get_id_for_value(lane));
		builder.addCapability(spv::CapabilityGroupNonUniformQuad);
	}
	else
	{
		// Have to emulate this with Shuffle.
		spv::Id local_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSubgroupLocalInvocationId);
		{
			Operation *load_op = impl.allocate(spv::OpLoad, builder.makeUintType(32));
			load_op->add_id(local_id);
			impl.add(load_op);
			local_id = load_op->id;
		}

		{
			Operation *mask_op = impl.allocate(spv::OpBitwiseAnd, builder.makeUintType(32));
			mask_op->add_id(local_id);
			mask_op->add_id(builder.makeUintConstant(~3u));
			impl.add(mask_op);
			local_id = mask_op->id;
		}

		{
			Operation *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
			add_op->add_id(local_id);
			add_op->add_id(impl.get_id_for_value(lane));
			impl.add(add_op);
			local_id = add_op->id;
		}

		// Use Shuffle for non-fragment stages.
		op = impl.allocate(spv::OpGroupNonUniformShuffle, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(local_id);

		builder.addCapability(spv::CapabilityGroupNonUniformShuffle);

		// For shuffle, wave64 is particularly slow on RDNA, so suggest wave32.
		impl.suggest_maximum_wave_size(32);
	}

	impl.shader_analysis.require_subgroup_shuffles = true;

	impl.add(op);
	return true;
}